

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O0

void __thiscall QuadList<SSTableDataEntry>::clear(QuadList<SSTableDataEntry> *this)

{
  QuadListNode<SSTableDataEntry> *pQVar1;
  QuadListNode<SSTableDataEntry> *next;
  QuadListNode<SSTableDataEntry> *current;
  QuadList<SSTableDataEntry> *this_local;
  
  pQVar1 = this->header->succ;
  while (next = pQVar1, next != this->trailer) {
    pQVar1 = next->succ;
    if (next != (QuadListNode<SSTableDataEntry> *)0x0) {
      QuadListNode<SSTableDataEntry>::~QuadListNode(next);
      operator_delete(next,0x60);
    }
  }
  return;
}

Assistant:

void QuadList<T>::clear() {
    auto *current = header->succ;
    while (current != trailer) {
        auto *next = current->succ;
        delete current;
        current = next;
    }
}